

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

QString * QMakeEvaluator::formatValueListList
                    (QString *__return_storage_ptr__,QList<ProStringList> *lists)

{
  long lVar1;
  ProStringList *list;
  ProStringList *vals;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QLatin1String local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  vals = (lists->d).ptr;
  for (lVar1 = (lists->d).size * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    if ((__return_storage_ptr__->d).size != 0) {
      QLatin1String::QLatin1String(&local_48,", ");
      QString::append((QLatin1String *)__return_storage_ptr__);
    }
    formatValueList((QString *)&local_60,vals,false);
    QString::append((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    vals = vals + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMakeEvaluator::formatValueListList(const QList<ProStringList> &lists)
{
    QString ret;

    for (const ProStringList &list : lists) {
        if (!ret.isEmpty())
            ret += QLatin1String(", ");
        ret += formatValueList(list);
    }
    return ret;
}